

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jasmin.cpp
# Opt level: O1

void __thiscall Oric::Jasmin::set_motor_on(Jasmin *this,bool on)

{
  Observer *pOVar1;
  Drive *this_00;
  long *local_40 [2];
  long local_30 [2];
  
  (this->super_DiskController).field_0x4e4 = on;
  this_00 = Storage::Disk::Controller::get_drive((Controller *)this);
  Storage::Disk::Drive::set_motor_on(this_00,(bool)(this->super_DiskController).field_0x4e4);
  pOVar1 = this->observer_;
  if (pOVar1 != (Observer *)0x0) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Jasmin","");
    (*pOVar1->_vptr_Observer[4])(pOVar1,(string *)local_40,(ulong)on);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return;
}

Assistant:

void Jasmin::set_motor_on(bool on) {
	motor_on_ = on;
	get_drive().set_motor_on(motor_on_);
	if(observer_) {
		observer_->set_led_status("Jasmin", on);
	}
}